

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void __thiscall
despot::option::PrintUsageImplementation::LineWrapper::process
          (LineWrapper *this,IStringWriter *write,char *data,int len)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int len_00;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  this->wrote_something = false;
  do {
    while( true ) {
      if (len < 1) {
        if (this->wrote_something == false) {
          write_one_line(this,write);
          return;
        }
        return;
      }
      iVar8 = this->width;
      if (iVar8 < len) break;
LAB_0016e34f:
      output(this,write,data,len);
      len = 0;
    }
    iVar7 = 0;
    uVar6 = 0;
    while( true ) {
      len_00 = (int)uVar6;
      if ((len - len_00 == 0 || len < len_00) || (iVar8 <= iVar7)) break;
      bVar1 = data[uVar6];
      if (bVar1 < 0xc2) {
        iVar5 = 1;
      }
      else {
        uVar3 = bVar1 ^ 0xff;
        iVar5 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> iVar5 == 0; iVar5 = iVar5 + -1) {
          }
        }
        uVar3 = ((uint)bVar1 << (~(byte)iVar5 & 0x1f)) >> (~(byte)iVar5 & 0x1f);
        lVar4 = 1;
        while ((iVar5 = len - len_00, len_00 + (int)lVar4 < len &&
               (iVar5 = (int)lVar4, ((byte)data[lVar4 + uVar6] ^ 0x80) < 0x40))) {
          uVar3 = uVar3 << 6 ^ (uint)(byte)data[lVar4 + uVar6] ^ 0x80;
          lVar4 = lVar4 + 1;
        }
        if (0x10ff < uVar3) {
          bVar2 = isWideChar(uVar3);
          iVar8 = this->width;
          if (bVar2) {
            if (iVar8 < iVar7 + 2) break;
            iVar7 = iVar7 + 1;
          }
        }
      }
      iVar7 = iVar7 + 1;
      uVar6 = (ulong)(uint)(len_00 + iVar5);
    }
    uVar9 = uVar6;
    if (len == len_00) goto LAB_0016e34f;
    while (iVar8 = (int)uVar9, -1 < iVar8) {
      if (data[uVar9] == ' ') {
        output(this,write,data,iVar8);
        uVar6 = (ulong)(iVar8 + 1);
        goto LAB_0016e3a8;
      }
      uVar9 = (ulong)(iVar8 - 1);
    }
    output(this,write,data,len_00);
LAB_0016e3a8:
    data = data + uVar6;
    len = len - (int)uVar6;
  } while( true );
}

Assistant:

void process(IStringWriter& write, const char* data, int len) {
			wrote_something = false;

			while (len > 0) {
				if (len <= width) // quick test that works because utf8width <= len (all wide chars have at least 2 bytes)
					{
					output(write, data, len);
					len = 0;
				} else // if (len > width)  it's possible (but not guaranteed) that utf8len > width
				{
					int utf8width = 0;
					int maxi = 0;
					while (maxi < len && utf8width < width) {
						int charbytes = 1;
						unsigned ch = (unsigned char) data[maxi];
						if (ch > 0xC1) // everything <= 0xC1 (yes, even 0xC1 itself) is not a valid UTF-8 start byte
							{
							// int __builtin_clz (unsigned int x)
							// Returns the number of leading 0-bits in x, starting at the most significant bit
							unsigned mask = (unsigned) -1
								>> __builtin_clz(ch ^ 0xff);
							ch = ch & mask; // mask out length bits, we don't verify their correctness
							while ((maxi + charbytes < len) && //
								(((unsigned char) data[maxi + charbytes] ^ 0x80)
									<= 0x3F)) // while next byte is continuation byte
							{
								ch = (ch << 6)
									^ (unsigned char) data[maxi + charbytes]
									^ 0x80; // add continuation to char code
								++charbytes;
							}
							// ch is the decoded unicode code point
							if (ch >= 0x1100 && isWideChar(ch)) // the test for 0x1100 is here to avoid the function call in the Latin case
								{
								if (utf8width + 2 > width)
									break;
								++utf8width;
							}
						}
						++utf8width;
						maxi += charbytes;
					}

					// data[maxi-1] is the last byte of the UTF-8 sequence of the last character that fits
					// onto the 1st line. If maxi == len, all characters fit on the line.

					if (maxi == len) {
						output(write, data, len);
						len = 0;
					} else // if (maxi < len)  at least 1 character (data[maxi] that is) doesn't fit on the line
					{
						int i;
						for (i = maxi; i >= 0; --i)
							if (data[i] == ' ')
								break;

						if (i >= 0) {
							output(write, data, i);
							data += i + 1;
							len -= i + 1;
						} else // did not find a space to split at => split before data[maxi]
						{ // data[maxi] is always the beginning of a character, never a continuation byte
							output(write, data, maxi);
							data += maxi;
							len -= maxi;
						}
					}
				}
			}
			if (!wrote_something) // if we didn't already write something to make space in the buffer
				write_one_line(write); // write at most one line of actual output
		}